

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int whereInScanEst(Parse *pParse,WhereLoopBuilder *pBuilder,ExprList *pList,tRowcnt *pnRow)

{
  int iVar1;
  int iVar2;
  u64 uVar3;
  uint uVar4;
  ExprList_item *pEVar5;
  tRowcnt tVar6;
  long lVar7;
  tRowcnt nEst;
  tRowcnt local_4c;
  tRowcnt *local_48;
  ExprList *local_40;
  Parse *local_38;
  
  local_48 = pnRow;
  local_38 = pParse;
  uVar3 = sqlite3LogEstToInt(*((pBuilder->pNew->u).btree.pIndex)->aiRowLogEst);
  if (pList->nExpr < 1) {
    uVar4 = 0;
  }
  else {
    iVar1 = pBuilder->nRecValid;
    pEVar5 = pList->a;
    uVar4 = 0;
    lVar7 = 0;
    local_40 = pList;
    do {
      local_4c = (tRowcnt)uVar3;
      iVar2 = whereEqualScanEst(local_38,pBuilder,pEVar5->pExpr,&local_4c);
      pBuilder->nRecValid = iVar1;
      if (iVar2 != 0) {
        return iVar2;
      }
      uVar4 = uVar4 + local_4c;
      lVar7 = lVar7 + 1;
      pEVar5 = pEVar5 + 1;
    } while (lVar7 < local_40->nExpr);
  }
  tVar6 = (tRowcnt)uVar3;
  if ((long)(ulong)uVar4 <= (long)uVar3) {
    tVar6 = uVar4;
  }
  *local_48 = tVar6;
  return 0;
}

Assistant:

static int whereInScanEst(
  Parse *pParse,       /* Parsing & code generating context */
  WhereLoopBuilder *pBuilder,
  ExprList *pList,     /* The value list on the RHS of "x IN (v1,v2,v3,...)" */
  tRowcnt *pnRow       /* Write the revised row estimate here */
){
  Index *p = pBuilder->pNew->u.btree.pIndex;
  i64 nRow0 = sqlite3LogEstToInt(p->aiRowLogEst[0]);
  int nRecValid = pBuilder->nRecValid;
  int rc = SQLITE_OK;     /* Subfunction return code */
  tRowcnt nEst;           /* Number of rows for a single term */
  tRowcnt nRowEst = 0;    /* New estimate of the number of rows */
  int i;                  /* Loop counter */

  assert( p->aSample!=0 );
  for(i=0; rc==SQLITE_OK && i<pList->nExpr; i++){
    nEst = nRow0;
    rc = whereEqualScanEst(pParse, pBuilder, pList->a[i].pExpr, &nEst);
    nRowEst += nEst;
    pBuilder->nRecValid = nRecValid;
  }

  if( rc==SQLITE_OK ){
    if( nRowEst > nRow0 ) nRowEst = nRow0;
    *pnRow = nRowEst;
    WHERETRACE(0x10,("IN row estimate: est=%d\n", nRowEst));
  }
  assert( pBuilder->nRecValid==nRecValid );
  return rc;
}